

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# msa_helper.c
# Opt level: O2

void helper_msa_max_a_w_mips64el(CPUMIPSState_conflict10 *env,uint32_t wd,uint32_t ws,uint32_t wt)

{
  fpr_t *pfVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  uint uVar7;
  uint uVar8;
  uint uVar9;
  uint uVar10;
  uint uVar11;
  uint uVar12;
  uint uVar13;
  
  pfVar1 = (env->active_fpu).fpr + ws;
  uVar2 = pfVar1->fs[0];
  uVar3 = pfVar1->fs[1];
  uVar4 = pfVar1->fs[2];
  uVar5 = pfVar1->fs[3];
  pfVar1 = (env->active_fpu).fpr + wt;
  uVar6 = pfVar1->fs[0];
  uVar7 = pfVar1->fs[1];
  uVar8 = pfVar1->fs[2];
  uVar9 = pfVar1->fs[3];
  uVar10 = -(uint)((int)((uVar6 ^ (int)uVar6 >> 0x1f) - ((int)uVar6 >> 0x1f) ^ 0x80000000) <
                  (int)((uVar2 ^ (int)uVar2 >> 0x1f) - ((int)uVar2 >> 0x1f) ^ 0x80000000));
  uVar11 = -(uint)((int)((uVar7 ^ (int)uVar7 >> 0x1f) - ((int)uVar7 >> 0x1f) ^ 0x80000000) <
                  (int)((uVar3 ^ (int)uVar3 >> 0x1f) - ((int)uVar3 >> 0x1f) ^ 0x80000000));
  uVar12 = -(uint)((int)((uVar8 ^ (int)uVar8 >> 0x1f) - ((int)uVar8 >> 0x1f) ^ 0x80000000) <
                  (int)((uVar4 ^ (int)uVar4 >> 0x1f) - ((int)uVar4 >> 0x1f) ^ 0x80000000));
  uVar13 = -(uint)((int)((uVar9 ^ (int)uVar9 >> 0x1f) - ((int)uVar9 >> 0x1f) ^ 0x80000000) <
                  (int)((uVar5 ^ (int)uVar5 >> 0x1f) - ((int)uVar5 >> 0x1f) ^ 0x80000000));
  pfVar1 = (env->active_fpu).fpr + wd;
  pfVar1->fs[0] = ~uVar10 & uVar6 | uVar2 & uVar10;
  pfVar1->fs[1] = ~uVar11 & uVar7 | uVar3 & uVar11;
  pfVar1->fs[2] = ~uVar12 & uVar8 | uVar4 & uVar12;
  pfVar1->fs[3] = ~uVar13 & uVar9 | uVar5 & uVar13;
  return;
}

Assistant:

void helper_msa_max_a_w(CPUMIPSState *env,
                        uint32_t wd, uint32_t ws, uint32_t wt)
{
    wr_t *pwd = &(env->active_fpu.fpr[wd].wr);
    wr_t *pws = &(env->active_fpu.fpr[ws].wr);
    wr_t *pwt = &(env->active_fpu.fpr[wt].wr);

    pwd->w[0]  = msa_max_a_df(DF_WORD, pws->w[0],  pwt->w[0]);
    pwd->w[1]  = msa_max_a_df(DF_WORD, pws->w[1],  pwt->w[1]);
    pwd->w[2]  = msa_max_a_df(DF_WORD, pws->w[2],  pwt->w[2]);
    pwd->w[3]  = msa_max_a_df(DF_WORD, pws->w[3],  pwt->w[3]);
}